

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,Vec_Int_t *vVisit)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int *piVar3;
  int local_34;
  int i;
  int *pMapping;
  Vec_Int_t *vVisit_local;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  iVar1 = Saig_ManBmcLiteral(p,pObj,iFrame);
  if ((iVar1 == -1) && (iVar1 = Aig_ObjIsTravIdCurrent(p->pAig,pObj), iVar1 == 0)) {
    Aig_ObjSetTravIdCurrent(p->pAig,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                        ,0x488,
                        "void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *, Aig_Obj_t *, int, Vec_Int_t *)"
                       );
        }
        piVar3 = Saig_ManBmcMapping(p,pObj);
        for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
          if (piVar3[local_34 + 1] != -1) {
            pAVar2 = Aig_ManObj(p->pAig,piVar3[local_34 + 1]);
            Saig_ManBmcCreateCnf_iter(p,pAVar2,iFrame,vVisit);
          }
        }
      }
      else {
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManBmcCreateCnf_iter(p,pAVar2,iFrame,vVisit);
      }
    }
    else {
      iVar1 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar1 != 0) {
        pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
        Vec_IntPush(vVisit,pAVar2->Id);
      }
    }
  }
  return;
}

Assistant:

void Saig_ManBmcCreateCnf_iter( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, Vec_Int_t * vVisit )
{
    if ( Saig_ManBmcLiteral( p, pObj, iFrame ) != ~0 )
        return; 
    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            Vec_IntPush( vVisit, Saig_ObjLoToLi(p->pAig, pObj)->Id );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManBmcCreateCnf_iter( p, Aig_ObjFanin0(pObj), iFrame, vVisit );
        return;
    }
    else
    {
        int * pMapping, i;
        assert( Aig_ObjIsNode(pObj) );
        pMapping = Saig_ManBmcMapping( p, pObj );
        for ( i = 0; i < 4; i++ )
            if ( pMapping[i+1] != -1 )
                Saig_ManBmcCreateCnf_iter( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame, vVisit );
    }
}